

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O0

RPCHelpMan * wallet::walletcreatefundedpsbt(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCArg> __l_01;
  initializer_list<RPCArg> __l_02;
  initializer_list<RPCArg> __l_03;
  initializer_list<RPCResult> __l_04;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffc1b8;
  allocator<RPCArg> *paVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  RPCArg *this_00;
  UniValue *in_stack_ffffffffffffc1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffc1c8;
  undefined4 in_stack_ffffffffffffc1d0;
  VType in_stack_ffffffffffffc1d4;
  UniValue *in_stack_ffffffffffffc1d8;
  string *in_stack_ffffffffffffc1e8;
  string *in_stack_ffffffffffffc1f0;
  UniValue *in_stack_ffffffffffffc1f8;
  iterator in_stack_ffffffffffffc200;
  RPCArgOptions *in_stack_ffffffffffffc208;
  string *in_stack_ffffffffffffc210;
  undefined7 in_stack_ffffffffffffc218;
  undefined1 in_stack_ffffffffffffc21f;
  undefined4 in_stack_ffffffffffffc220;
  Type in_stack_ffffffffffffc224;
  string *in_stack_ffffffffffffc228;
  undefined4 in_stack_ffffffffffffc230;
  Type in_stack_ffffffffffffc234;
  undefined4 in_stack_ffffffffffffc238;
  Type in_stack_ffffffffffffc23c;
  RPCArg *in_stack_ffffffffffffc240;
  RPCArgOptions *in_stack_ffffffffffffc260;
  undefined1 *local_3d38;
  undefined1 *local_3d20;
  undefined1 *local_3d08;
  RPCExamples *in_stack_ffffffffffffc300;
  RPCResults *in_stack_ffffffffffffc308;
  undefined1 *puVar3;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_ffffffffffffc310;
  string *in_stack_ffffffffffffc318;
  string *in_stack_ffffffffffffc320;
  RPCHelpMan *in_stack_ffffffffffffc328;
  undefined1 *local_3cc0;
  RPCMethodImpl *fun;
  undefined1 local_38c0 [38];
  allocator<char> local_389a [2];
  pointer local_3898;
  pointer pRStack_3890;
  pointer local_3888;
  allocator<char> local_387a;
  allocator<char> local_3879 [32];
  allocator<char> local_3859 [31];
  allocator<char> local_383a;
  allocator<char> local_3839 [31];
  allocator<char> local_381a;
  allocator<char> local_3819 [29];
  allocator<char> local_37fc;
  undefined1 local_37fb;
  allocator<char> local_37fa;
  allocator<char> local_37f9;
  vector<RPCArg,_std::allocator<RPCArg>_> local_37f8;
  allocator<char> local_37dc;
  allocator<char> local_37db [2];
  undefined1 local_37d9 [39];
  allocator<char> local_37b2;
  allocator<char> local_37b1;
  allocator<char> local_37b0;
  allocator<char> local_37af;
  allocator<char> local_37ae;
  allocator<char> local_37ad;
  allocator<char> local_37ac;
  undefined1 local_37ab;
  allocator<char> local_37aa;
  allocator<char> local_37a9;
  allocator<char> local_37a8;
  allocator<char> local_37a7;
  allocator<char> local_37a6;
  allocator<char> local_37a5;
  allocator<char> local_37a4;
  allocator<char> local_37a3;
  allocator<char> local_37a2;
  allocator<char> local_37a1;
  allocator<char> local_37a0;
  allocator<char> local_379f;
  allocator<char> local_379e;
  allocator<char> local_379d;
  undefined4 local_379c;
  allocator<char> local_3796;
  allocator<char> local_3795;
  undefined4 local_3794;
  allocator<char> local_378f;
  allocator<char> local_378e;
  undefined1 local_378d;
  allocator<char> local_378c;
  allocator<char> local_378b;
  allocator<char> local_378a;
  allocator<char> local_3789 [56];
  allocator<char> local_3751;
  undefined4 local_3750;
  allocator<char> local_374a;
  allocator<char> local_3749;
  undefined4 local_3748;
  allocator<char> local_3741 [32];
  allocator<char> local_3721;
  undefined4 local_3720;
  allocator<char> local_371a [3];
  allocator<char> local_3717;
  allocator<char> local_3716;
  allocator<char> local_3715;
  allocator<char> local_3714;
  allocator<char> local_3713;
  allocator<char> local_3712;
  allocator<char> local_3711;
  undefined4 local_3710;
  allocator<char> local_370a;
  allocator<char> local_3709;
  undefined4 local_3708;
  allocator<char> local_3701 [32];
  allocator<char> local_36e1;
  undefined4 local_36e0;
  allocator<char> local_36d9 [32];
  allocator<char> local_36b9;
  undefined4 local_36b8;
  allocator<char> local_36b1 [31];
  allocator<char> local_3692;
  allocator<char> local_3691 [385];
  undefined1 local_3510 [408];
  undefined1 local_3378 [200];
  undefined1 local_32b0;
  undefined8 local_3288;
  undefined8 uStack_3280;
  undefined8 local_3278;
  undefined1 local_3270;
  undefined1 local_326f;
  allocator<RPCArg> local_3170 [40];
  undefined8 local_3148;
  undefined8 uStack_3140;
  undefined8 local_3138;
  undefined1 local_3130;
  undefined1 local_312f;
  undefined1 local_3128;
  undefined8 local_3100;
  undefined8 uStack_30f8;
  undefined8 local_30f0;
  undefined1 local_30e8;
  undefined1 local_30e7;
  undefined8 local_3000;
  allocator<RPCArg> local_2fe8 [40];
  undefined8 local_2fc0;
  undefined8 uStack_2fb8;
  undefined8 local_2fb0;
  undefined1 local_2fa8;
  undefined1 local_2fa7;
  undefined1 local_2fa0;
  undefined8 local_2f78;
  undefined8 uStack_2f70;
  undefined8 local_2f68;
  undefined1 local_2f60;
  undefined1 local_2f5f;
  undefined1 local_2eb8 [264];
  undefined1 local_2db0 [280];
  undefined1 local_2c98;
  undefined8 local_2c70;
  undefined8 uStack_2c68;
  undefined8 local_2c60;
  undefined1 local_2c58;
  undefined1 local_2c57;
  undefined1 local_2b70;
  undefined8 local_2b48;
  undefined8 uStack_2b40;
  undefined8 local_2b38;
  undefined1 local_2b30;
  undefined1 local_2b2f;
  undefined1 local_2a48;
  undefined8 local_2a20;
  undefined8 uStack_2a18;
  undefined8 local_2a10;
  undefined1 local_2a08;
  undefined1 local_2a07;
  undefined1 local_2908;
  undefined8 local_28e0;
  undefined8 uStack_28d8;
  undefined8 local_28d0;
  undefined1 local_28c8;
  undefined1 local_28c7;
  undefined1 local_2800;
  undefined8 local_27d8;
  undefined8 uStack_27d0;
  undefined8 local_27c8;
  undefined1 local_27c0;
  undefined1 local_27bf;
  undefined1 local_26f8;
  undefined8 local_26d0;
  undefined8 uStack_26c8;
  undefined8 local_26c0;
  undefined1 local_26b8;
  undefined1 local_26b7;
  undefined1 local_25f0;
  undefined8 local_25c8;
  undefined8 uStack_25c0;
  undefined8 local_25b8;
  undefined1 local_25b0;
  undefined1 local_25af;
  undefined1 local_24e8;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 local_24b0;
  undefined1 local_24a8;
  undefined1 local_24a7;
  undefined1 local_2400;
  undefined8 local_23d8;
  undefined8 uStack_23d0;
  undefined8 local_23c8;
  undefined1 local_23c0;
  undefined1 local_23bf;
  undefined1 local_22c0;
  undefined8 local_2298;
  undefined8 uStack_2290;
  undefined8 local_2288;
  undefined1 local_2280;
  undefined1 local_227f;
  undefined1 local_2180;
  undefined8 local_2158;
  undefined8 uStack_2150;
  undefined8 local_2148;
  undefined1 local_2140;
  undefined1 local_213f;
  undefined1 local_2078 [120];
  undefined8 local_2000;
  undefined1 local_1310 [160];
  undefined1 local_1270;
  undefined8 local_1248;
  undefined8 uStack_1240;
  undefined8 local_1238;
  undefined1 local_1230;
  undefined1 local_122f;
  allocator<RPCArg> local_1130 [40];
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined1 local_10f0;
  undefined1 local_10ef;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1048;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 local_1010;
  undefined1 local_1008;
  undefined1 local_1007;
  ulong local_1000 [5];
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  undefined1 local_fc0;
  undefined1 local_fbf;
  undefined1 local_fb8;
  undefined8 local_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined1 local_f78;
  undefined1 local_f77;
  undefined1 local_eb0;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined1 local_e70;
  undefined1 local_e6f;
  undefined1 local_da8;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 local_d70;
  undefined1 local_d68;
  undefined1 local_d67;
  undefined1 local_cc0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined1 local_c80;
  undefined1 local_c7f;
  undefined1 local_bd8 [1056];
  undefined1 local_7b8 [160];
  undefined1 local_718 [264];
  undefined1 local_610 [160];
  undefined1 local_570 [1320];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000[0] = 0;
  local_2000 = 0;
  local_3000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_36b8 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc1c8,&in_stack_ffffffffffffc1c0->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_36e0 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc1c8,&in_stack_ffffffffffffc1c0->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_3708 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc1c8,&in_stack_ffffffffffffc1c0->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_cc0 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc1d4,in_stack_ffffffffffffc1d0));
  local_c98 = 0;
  uStack_c90 = 0;
  local_c88 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffc1b8);
  local_c80 = 0;
  local_c7f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc234,in_stack_ffffffffffffc230),
                 in_stack_ffffffffffffc228,in_stack_ffffffffffffc224,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc21f,in_stack_ffffffffffffc218),
                 in_stack_ffffffffffffc210,in_stack_ffffffffffffc208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_3710 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc1c8,&in_stack_ffffffffffffc1c0->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_da8 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc1d4,in_stack_ffffffffffffc1d0));
  local_d80 = 0;
  uStack_d78 = 0;
  local_d70 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffc1b8);
  local_d68 = 0;
  local_d67 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc234,in_stack_ffffffffffffc230),
                 in_stack_ffffffffffffc228,in_stack_ffffffffffffc224,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc21f,in_stack_ffffffffffffc218),
                 in_stack_ffffffffffffc210,in_stack_ffffffffffffc208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc1c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_eb0 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc1d4,in_stack_ffffffffffffc1d0));
  local_e88 = 0;
  uStack_e80 = 0;
  local_e78 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffc1b8);
  local_e70 = 0;
  local_e6f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc234,in_stack_ffffffffffffc230),
                 in_stack_ffffffffffffc228,in_stack_ffffffffffffc224,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc21f,in_stack_ffffffffffffc218),
                 in_stack_ffffffffffffc210,in_stack_ffffffffffffc208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc1c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_fb8 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc1d4,in_stack_ffffffffffffc1d0));
  local_f90 = 0;
  uStack_f88 = 0;
  local_f80 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffc1b8);
  local_f78 = 0;
  local_f77 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc234,in_stack_ffffffffffffc230),
                 in_stack_ffffffffffffc228,in_stack_ffffffffffffc224,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc21f,in_stack_ffffffffffffc218),
                 in_stack_ffffffffffffc210,in_stack_ffffffffffffc208);
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffc1b8);
  __l._M_len = (size_type)in_stack_ffffffffffffc208;
  __l._M_array = in_stack_ffffffffffffc200;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc1f8,__l,
             (allocator_type *)in_stack_ffffffffffffc1f0);
  local_1000[0] = local_1000[0] & 0xffffffffffffff00;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc1d4,in_stack_ffffffffffffc1d0));
  local_fd8 = 0;
  uStack_fd0 = 0;
  local_fc8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffc1b8);
  local_fc0 = 0;
  local_fbf = 0;
  paVar2 = (allocator<RPCArg> *)local_1000;
  RPCArg::RPCArg(in_stack_ffffffffffffc240,
                 (string *)CONCAT44(in_stack_ffffffffffffc23c,in_stack_ffffffffffffc238),
                 in_stack_ffffffffffffc234,(Fallback *)in_stack_ffffffffffffc228,
                 (string *)CONCAT44(in_stack_ffffffffffffc224,in_stack_ffffffffffffc220),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffc21f,in_stack_ffffffffffffc218),
                 in_stack_ffffffffffffc260);
  std::allocator<RPCArg>::allocator(paVar2);
  __l_00._M_len = (size_type)in_stack_ffffffffffffc208;
  __l_00._M_array = in_stack_ffffffffffffc200;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc1f8,__l_00,
             (allocator_type *)in_stack_ffffffffffffc1f0);
  local_1048.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc1d4,in_stack_ffffffffffffc1d0));
  local_1020 = 0;
  uStack_1018 = 0;
  local_1010 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1008 = 0;
  local_1007 = 0;
  this = &local_1048;
  RPCArg::RPCArg(in_stack_ffffffffffffc240,
                 (string *)CONCAT44(in_stack_ffffffffffffc23c,in_stack_ffffffffffffc238),
                 in_stack_ffffffffffffc234,(Fallback *)in_stack_ffffffffffffc228,
                 (string *)CONCAT44(in_stack_ffffffffffffc224,in_stack_ffffffffffffc220),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffc21f,in_stack_ffffffffffffc218),
                 in_stack_ffffffffffffc260);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_3720 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc1c8,&in_stack_ffffffffffffc1c0->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  OutputsDoc();
  local_1130[0] = (allocator<RPCArg>)0x1;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc1d4,in_stack_ffffffffffffc1d0));
  local_1108 = 0;
  uStack_1100 = 0;
  local_10f8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(this);
  local_10f0 = 0;
  local_10ef = 0;
  paVar2 = local_1130;
  RPCArg::RPCArg(in_stack_ffffffffffffc240,
                 (string *)CONCAT44(in_stack_ffffffffffffc23c,in_stack_ffffffffffffc238),
                 in_stack_ffffffffffffc234,(Fallback *)in_stack_ffffffffffffc228,
                 (string *)CONCAT44(in_stack_ffffffffffffc224,in_stack_ffffffffffffc220),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffc21f,in_stack_ffffffffffffc218),
                 in_stack_ffffffffffffc260);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_3748 = 0;
  UniValue::UniValue<int,_int,_true>(in_stack_ffffffffffffc1f8,(int *)in_stack_ffffffffffffc1f0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc1c8,in_stack_ffffffffffffc1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_1270 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc1d4,in_stack_ffffffffffffc1d0));
  local_1248 = 0;
  uStack_1240 = 0;
  local_1238 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1230 = 0;
  local_122f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc234,in_stack_ffffffffffffc230),
                 in_stack_ffffffffffffc228,in_stack_ffffffffffffc224,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc21f,in_stack_ffffffffffffc218),
                 in_stack_ffffffffffffc210,in_stack_ffffffffffffc208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_3750 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc1c8,&in_stack_ffffffffffffc1c0->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc1c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_2180 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc1d4,in_stack_ffffffffffffc1d0));
  local_2158 = 0;
  uStack_2150 = 0;
  local_2148 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_2140 = 0;
  local_213f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc234,in_stack_ffffffffffffc230),
                 in_stack_ffffffffffffc228,in_stack_ffffffffffffc224,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc21f,in_stack_ffffffffffffc218),
                 in_stack_ffffffffffffc210,in_stack_ffffffffffffc208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_378d = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffc1f8,(bool *)in_stack_ffffffffffffc1f0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc1c8,in_stack_ffffffffffffc1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_22c0 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc1d4,in_stack_ffffffffffffc1d0));
  local_2298 = 0;
  uStack_2290 = 0;
  local_2288 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_2280 = 0;
  local_227f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc234,in_stack_ffffffffffffc230),
                 in_stack_ffffffffffffc228,in_stack_ffffffffffffc224,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc21f,in_stack_ffffffffffffc218),
                 in_stack_ffffffffffffc210,in_stack_ffffffffffffc208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_3794 = 0;
  UniValue::UniValue<int,_int,_true>(in_stack_ffffffffffffc1f8,(int *)in_stack_ffffffffffffc1f0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc1c8,in_stack_ffffffffffffc1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_2400 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc1d4,in_stack_ffffffffffffc1d0));
  local_23d8 = 0;
  uStack_23d0 = 0;
  local_23c8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_23c0 = 0;
  local_23bf = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc234,in_stack_ffffffffffffc230),
                 in_stack_ffffffffffffc228,in_stack_ffffffffffffc224,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc21f,in_stack_ffffffffffffc218),
                 in_stack_ffffffffffffc210,in_stack_ffffffffffffc208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_379c = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc1c8,&in_stack_ffffffffffffc1c0->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_24e8 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc1d4,in_stack_ffffffffffffc1d0));
  local_24c0 = 0;
  uStack_24b8 = 0;
  local_24b0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_24a8 = 0;
  local_24a7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc234,in_stack_ffffffffffffc230),
                 in_stack_ffffffffffffc228,in_stack_ffffffffffffc224,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc21f,in_stack_ffffffffffffc218),
                 in_stack_ffffffffffffc210,in_stack_ffffffffffffc208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc1c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_25f0 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc1d4,in_stack_ffffffffffffc1d0));
  local_25c8 = 0;
  uStack_25c0 = 0;
  local_25b8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_25b0 = 0;
  local_25af = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc234,in_stack_ffffffffffffc230),
                 in_stack_ffffffffffffc228,in_stack_ffffffffffffc224,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc21f,in_stack_ffffffffffffc218),
                 in_stack_ffffffffffffc210,in_stack_ffffffffffffc208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc1c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_26f8 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc1d4,in_stack_ffffffffffffc1d0));
  local_26d0 = 0;
  uStack_26c8 = 0;
  local_26c0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_26b8 = 0;
  local_26b7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc234,in_stack_ffffffffffffc230),
                 in_stack_ffffffffffffc228,in_stack_ffffffffffffc224,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc21f,in_stack_ffffffffffffc218),
                 in_stack_ffffffffffffc210,in_stack_ffffffffffffc208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc1c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_2800 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc1d4,in_stack_ffffffffffffc1d0));
  local_27d8 = 0;
  uStack_27d0 = 0;
  local_27c8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_27c0 = 0;
  local_27bf = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc234,in_stack_ffffffffffffc230),
                 in_stack_ffffffffffffc228,in_stack_ffffffffffffc224,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc21f,in_stack_ffffffffffffc218),
                 in_stack_ffffffffffffc210,in_stack_ffffffffffffc208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc1c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_2908 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc1d4,in_stack_ffffffffffffc1d0));
  local_28e0 = 0;
  uStack_28d8 = 0;
  local_28d0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_28c8 = 0;
  local_28c7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc234,in_stack_ffffffffffffc230),
                 in_stack_ffffffffffffc228,in_stack_ffffffffffffc224,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc21f,in_stack_ffffffffffffc218),
                 in_stack_ffffffffffffc210,in_stack_ffffffffffffc208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_37ab = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffc1f8,(bool *)in_stack_ffffffffffffc1f0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc1c8,in_stack_ffffffffffffc1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_2a48 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc1d4,in_stack_ffffffffffffc1d0));
  local_2a20 = 0;
  uStack_2a18 = 0;
  local_2a10 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_2a08 = 0;
  local_2a07 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc234,in_stack_ffffffffffffc230),
                 in_stack_ffffffffffffc228,in_stack_ffffffffffffc224,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc21f,in_stack_ffffffffffffc218),
                 in_stack_ffffffffffffc210,in_stack_ffffffffffffc208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc1c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc1c0);
  std::operator+(&in_stack_ffffffffffffc208->skip_type_check,&in_stack_ffffffffffffc200->m_names);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffc1d4,in_stack_ffffffffffffc1d0),
                 (char *)in_stack_ffffffffffffc1c8);
  local_2b70 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc1d4,in_stack_ffffffffffffc1d0));
  local_2b48 = 0;
  uStack_2b40 = 0;
  local_2b38 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_2b30 = 0;
  local_2b2f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc234,in_stack_ffffffffffffc230),
                 in_stack_ffffffffffffc228,in_stack_ffffffffffffc224,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc21f,in_stack_ffffffffffffc218),
                 in_stack_ffffffffffffc210,in_stack_ffffffffffffc208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc1c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc1c0);
  std::operator+(&in_stack_ffffffffffffc208->skip_type_check,&in_stack_ffffffffffffc200->m_names);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffc1d4,in_stack_ffffffffffffc1d0),
                 (char *)in_stack_ffffffffffffc1c8);
  local_2c98 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc1d4,in_stack_ffffffffffffc1d0));
  local_2c70 = 0;
  uStack_2c68 = 0;
  local_2c60 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_2c58 = 0;
  local_2c57 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc234,in_stack_ffffffffffffc230),
                 in_stack_ffffffffffffc228,in_stack_ffffffffffffc224,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc21f,in_stack_ffffffffffffc218),
                 in_stack_ffffffffffffc210,in_stack_ffffffffffffc208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc1d4,in_stack_ffffffffffffc1d0));
  UniValue::UniValue(in_stack_ffffffffffffc1d8,in_stack_ffffffffffffc1d4,in_stack_ffffffffffffc1c8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc1c8,in_stack_ffffffffffffc1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_37d9._1_4_ = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc1c8,&in_stack_ffffffffffffc1c0->typ);
  fun = (RPCMethodImpl *)local_37d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_2fa0 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc1d4,in_stack_ffffffffffffc1d0));
  local_2f78 = 0;
  uStack_2f70 = 0;
  local_2f68 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_2f60 = 0;
  local_2f5f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc234,in_stack_ffffffffffffc230),
                 in_stack_ffffffffffffc228,in_stack_ffffffffffffc224,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc21f,in_stack_ffffffffffffc218),
                 in_stack_ffffffffffffc210,in_stack_ffffffffffffc208);
  std::allocator<RPCArg>::allocator(paVar2);
  __l_01._M_len = (size_type)in_stack_ffffffffffffc208;
  __l_01._M_array = in_stack_ffffffffffffc200;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc1f8,__l_01,
             (allocator_type *)in_stack_ffffffffffffc1f0);
  local_2fe8[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc1d4,in_stack_ffffffffffffc1d0));
  local_2fc0 = 0;
  uStack_2fb8 = 0;
  local_2fb0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_2fa8 = 0;
  local_2fa7 = 0;
  paVar2 = local_2fe8;
  RPCArg::RPCArg(in_stack_ffffffffffffc240,
                 (string *)CONCAT44(in_stack_ffffffffffffc23c,in_stack_ffffffffffffc238),
                 in_stack_ffffffffffffc234,(Fallback *)in_stack_ffffffffffffc228,
                 (string *)CONCAT44(in_stack_ffffffffffffc224,in_stack_ffffffffffffc220),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffc21f,in_stack_ffffffffffffc218),
                 in_stack_ffffffffffffc260);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  UniValue::UniValue<const_int_&,_int,_true>
            (in_stack_ffffffffffffc1f8,(int *)in_stack_ffffffffffffc1f0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc1c8,in_stack_ffffffffffffc1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_3128 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc1d4,in_stack_ffffffffffffc1d0));
  local_3100 = 0;
  uStack_30f8 = 0;
  local_30f0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_30e8 = 0;
  local_30e7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc234,in_stack_ffffffffffffc230),
                 in_stack_ffffffffffffc228,in_stack_ffffffffffffc224,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc21f,in_stack_ffffffffffffc218),
                 in_stack_ffffffffffffc210,in_stack_ffffffffffffc208);
  std::allocator<RPCArg>::allocator(paVar2);
  __l_02._M_len = (size_type)in_stack_ffffffffffffc208;
  __l_02._M_array = in_stack_ffffffffffffc200;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc1f8,__l_02,
             (allocator_type *)in_stack_ffffffffffffc1f0);
  FundTxDoc(&local_37f8,true);
  Cat<std::vector<RPCArg,std::allocator<RPCArg>>>
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc1f0,
             (vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc1e8);
  local_3170[0] = (allocator<RPCArg>)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_3148 = 0;
  uStack_3140 = 0;
  local_3138 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_3130 = 0;
  local_312f = 0;
  paVar2 = local_3170;
  RPCArg::RPCArg(in_stack_ffffffffffffc240,
                 (string *)CONCAT44(in_stack_ffffffffffffc23c,in_stack_ffffffffffffc238),
                 in_stack_ffffffffffffc234,(Fallback *)in_stack_ffffffffffffc228,
                 (string *)CONCAT44(in_stack_ffffffffffffc224,in_stack_ffffffffffffc220),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffc21f,in_stack_ffffffffffffc218),
                 in_stack_ffffffffffffc260);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_37fb = 1;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffc1f8,(bool *)in_stack_ffffffffffffc1f0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc1c8,in_stack_ffffffffffffc1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_32b0 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc1d4,in_stack_ffffffffffffc1d0));
  local_3288 = 0;
  uStack_3280 = 0;
  local_3278 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_3270 = 0;
  local_326f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc234,in_stack_ffffffffffffc230),
                 in_stack_ffffffffffffc228,in_stack_ffffffffffffc224,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc21f,in_stack_ffffffffffffc218),
                 in_stack_ffffffffffffc210,in_stack_ffffffffffffc208);
  std::allocator<RPCArg>::allocator(paVar2);
  __l_03._M_len = (size_type)in_stack_ffffffffffffc208;
  __l_03._M_array = in_stack_ffffffffffffc200;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc1f8,__l_03,
             (allocator_type *)in_stack_ffffffffffffc1f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_3859[1] = (allocator<char>)0x0;
  local_3859[2] = (allocator<char>)0x0;
  local_3859[3] = (allocator<char>)0x0;
  local_3859[4] = (allocator<char>)0x0;
  local_3859[5] = (allocator<char>)0x0;
  local_3859[6] = (allocator<char>)0x0;
  local_3859[7] = (allocator<char>)0x0;
  local_3859[8] = (allocator<char>)0x0;
  local_3859[9] = (allocator<char>)0x0;
  local_3859[10] = (allocator<char>)0x0;
  local_3859[0xb] = (allocator<char>)0x0;
  local_3859[0xc] = (allocator<char>)0x0;
  local_3859[0xd] = (allocator<char>)0x0;
  local_3859[0xe] = (allocator<char>)0x0;
  local_3859[0xf] = (allocator<char>)0x0;
  local_3859[0x10] = (allocator<char>)0x0;
  local_3859[0x11] = (allocator<char>)0x0;
  local_3859[0x12] = (allocator<char>)0x0;
  local_3859[0x13] = (allocator<char>)0x0;
  local_3859[0x14] = (allocator<char>)0x0;
  local_3859[0x15] = (allocator<char>)0x0;
  local_3859[0x16] = (allocator<char>)0x0;
  local_3859[0x17] = (allocator<char>)0x0;
  local_3859[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffc240,in_stack_ffffffffffffc23c,
             (string *)CONCAT44(in_stack_ffffffffffffc234,in_stack_ffffffffffffc230),
             in_stack_ffffffffffffc228,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffc224,in_stack_ffffffffffffc220),
             (bool)in_stack_ffffffffffffc21f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  std::operator+(&in_stack_ffffffffffffc208->skip_type_check,&in_stack_ffffffffffffc200->m_names);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffc1d4,in_stack_ffffffffffffc1d0),
                 (char *)in_stack_ffffffffffffc1c8);
  local_3879[1] = (allocator<char>)0x0;
  local_3879[2] = (allocator<char>)0x0;
  local_3879[3] = (allocator<char>)0x0;
  local_3879[4] = (allocator<char>)0x0;
  local_3879[5] = (allocator<char>)0x0;
  local_3879[6] = (allocator<char>)0x0;
  local_3879[7] = (allocator<char>)0x0;
  local_3879[8] = (allocator<char>)0x0;
  local_3879[9] = (allocator<char>)0x0;
  local_3879[10] = (allocator<char>)0x0;
  local_3879[0xb] = (allocator<char>)0x0;
  local_3879[0xc] = (allocator<char>)0x0;
  local_3879[0xd] = (allocator<char>)0x0;
  local_3879[0xe] = (allocator<char>)0x0;
  local_3879[0xf] = (allocator<char>)0x0;
  local_3879[0x10] = (allocator<char>)0x0;
  local_3879[0x11] = (allocator<char>)0x0;
  local_3879[0x12] = (allocator<char>)0x0;
  local_3879[0x13] = (allocator<char>)0x0;
  local_3879[0x14] = (allocator<char>)0x0;
  local_3879[0x15] = (allocator<char>)0x0;
  local_3879[0x16] = (allocator<char>)0x0;
  local_3879[0x17] = (allocator<char>)0x0;
  local_3879[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffc240,in_stack_ffffffffffffc23c,
             (string *)CONCAT44(in_stack_ffffffffffffc234,in_stack_ffffffffffffc230),
             in_stack_ffffffffffffc228,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffc224,in_stack_ffffffffffffc220),
             (bool)in_stack_ffffffffffffc21f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  local_3898 = (pointer)0x0;
  pRStack_3890 = (pointer)0x0;
  local_3888 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffc240,in_stack_ffffffffffffc23c,
             (string *)CONCAT44(in_stack_ffffffffffffc234,in_stack_ffffffffffffc230),
             in_stack_ffffffffffffc228,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffc224,in_stack_ffffffffffffc220),
             (bool)in_stack_ffffffffffffc21f);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)paVar2);
  __l_04._M_len = (size_type)in_stack_ffffffffffffc208;
  __l_04._M_array = (iterator)in_stack_ffffffffffffc200;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc1f8,__l_04,
             (allocator_type *)in_stack_ffffffffffffc1f0);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffc240,in_stack_ffffffffffffc23c,
             (string *)CONCAT44(in_stack_ffffffffffffc234,in_stack_ffffffffffffc230),
             in_stack_ffffffffffffc228,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffc224,in_stack_ffffffffffffc220),
             (bool)in_stack_ffffffffffffc21f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffc23c,in_stack_ffffffffffffc238),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffc234,in_stack_ffffffffffffc230));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc208,(char *)in_stack_ffffffffffffc200,
             (allocator<char> *)in_stack_ffffffffffffc1f8);
  HelpExampleCli(in_stack_ffffffffffffc1f0,in_stack_ffffffffffffc1e8);
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffc1d4,in_stack_ffffffffffffc1d0),
                 in_stack_ffffffffffffc1c8);
  RPCExamples::RPCExamples((RPCExamples *)paVar2,(string *)0x586c55);
  this_00 = (RPCArg *)local_38c0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::walletcreatefundedpsbt()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_ffffffffffffc1c8,(anon_class_1_0_00000001 *)in_stack_ffffffffffffc1c0);
  RPCHelpMan::RPCHelpMan
            (in_stack_ffffffffffffc328,in_stack_ffffffffffffc320,in_stack_ffffffffffffc318,
             in_stack_ffffffffffffc310,in_stack_ffffffffffffc308,in_stack_ffffffffffffc300,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_38c0 + 0x25));
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_389a);
  RPCResults::~RPCResults((RPCResults *)this_00);
  RPCResult::~RPCResult((RPCResult *)this_00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc1c8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_3cc0 = local_3378;
  do {
    local_3cc0 = local_3cc0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_3cc0 != local_3510);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc1c8);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_387a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3879);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc1c8);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3859);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc1c8);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_383a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3839);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_381a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3819);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc1c8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  puVar3 = local_570;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (puVar1 != puVar3);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_37fc);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_37fa);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::allocator<char>::~allocator(&local_37f9);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc1c8);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc1c8);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc1c8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  puVar3 = local_2078;
  puVar1 = local_1310;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (puVar1 != puVar3);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_37dc);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_37db);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc1c8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_3d08 = local_2db0;
  do {
    local_3d08 = local_3d08 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_3d08 != local_2eb8);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_37d9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_37d9 + 8));
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_37b2);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_37b1);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_37b0);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_37af);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_37ae);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_37ad);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_37ac);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_37aa);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_37a9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_37a8);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_37a7);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_37a6);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_37a5);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_37a4);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_37a3);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_37a2);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_37a1);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_37a0);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_379f);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_379e);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_379d);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3796);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3795);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_378f);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_378e);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_378c);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_378b);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_378a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3789);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3751);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_374a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3749);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3741);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc1c8);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3721);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_371a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc1c8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_3d20 = local_610;
  do {
    local_3d20 = local_3d20 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_3d20 != local_718);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc1c8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_3d38 = local_7b8;
  do {
    local_3d38 = local_3d38 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_3d38 != local_bd8);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3717);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3716);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3715);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3714);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3713);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3712);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3711);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_370a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3709);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3701);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_36e1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_36d9);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_36b9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_36b1);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_3692);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_3691);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan walletcreatefundedpsbt()
{
    return RPCHelpMan{"walletcreatefundedpsbt",
                "\nCreates and funds a transaction in the Partially Signed Transaction format.\n"
                "Implements the Creator and Updater roles.\n"
                "All existing inputs must either have their previous output transaction be in the wallet\n"
                "or be in the UTXO set. Solving data must be provided for non-wallet inputs.\n",
                {
                    {"inputs", RPCArg::Type::ARR, RPCArg::Optional::OMITTED, "Leave empty to add inputs automatically. See add_inputs option.",
                        {
                            {"", RPCArg::Type::OBJ, RPCArg::Optional::OMITTED, "",
                                {
                                    {"txid", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The transaction id"},
                                    {"vout", RPCArg::Type::NUM, RPCArg::Optional::NO, "The output number"},
                                    {"sequence", RPCArg::Type::NUM, RPCArg::DefaultHint{"depends on the value of the 'locktime' and 'options.replaceable' arguments"}, "The sequence number"},
                                    {"weight", RPCArg::Type::NUM, RPCArg::DefaultHint{"Calculated from wallet and solving data"}, "The maximum weight for this input, "
                                        "including the weight of the outpoint and sequence number. "
                                        "Note that signature sizes are not guaranteed to be consistent, "
                                        "so the maximum DER signatures size of 73 bytes should be used when considering ECDSA signatures."
                                        "Remember to convert serialized sizes to weight units when necessary."},
                                },
                            },
                        },
                        },
                    {"outputs", RPCArg::Type::ARR, RPCArg::Optional::NO, "The outputs specified as key-value pairs.\n"
                            "Each key may only appear once, i.e. there can only be one 'data' output, and no address may be duplicated.\n"
                            "At least one output of either type must be specified.\n"
                            "For compatibility reasons, a dictionary, which holds the key-value pairs directly, is also\n"
                            "accepted as second parameter.",
                        OutputsDoc(),
                        RPCArgOptions{.skip_type_check = true}},
                    {"locktime", RPCArg::Type::NUM, RPCArg::Default{0}, "Raw locktime. Non-0 value also locktime-activates inputs"},
                    {"options", RPCArg::Type::OBJ_NAMED_PARAMS, RPCArg::Optional::OMITTED, "",
                        Cat<std::vector<RPCArg>>(
                        {
                            {"add_inputs", RPCArg::Type::BOOL, RPCArg::DefaultHint{"false when \"inputs\" are specified, true otherwise"}, "Automatically include coins from the wallet to cover the target amount.\n"},
                            {"include_unsafe", RPCArg::Type::BOOL, RPCArg::Default{false}, "Include inputs that are not safe to spend (unconfirmed transactions from outside keys and unconfirmed replacement transactions).\n"
                                                          "Warning: the resulting transaction may become invalid if one of the unsafe inputs disappears.\n"
                                                          "If that happens, you will need to fund the transaction with different inputs and republish it."},
                            {"minconf", RPCArg::Type::NUM, RPCArg::Default{0}, "If add_inputs is specified, require inputs with at least this many confirmations."},
                            {"maxconf", RPCArg::Type::NUM, RPCArg::Optional::OMITTED, "If add_inputs is specified, require inputs with at most this many confirmations."},
                            {"changeAddress", RPCArg::Type::STR, RPCArg::DefaultHint{"automatic"}, "The bitcoin address to receive the change"},
                            {"changePosition", RPCArg::Type::NUM, RPCArg::DefaultHint{"random"}, "The index of the change output"},
                            {"change_type", RPCArg::Type::STR, RPCArg::DefaultHint{"set by -changetype"}, "The output type to use. Only valid if changeAddress is not specified. Options are \"legacy\", \"p2sh-segwit\", \"bech32\", and \"bech32m\"."},
                            {"includeWatching", RPCArg::Type::BOOL, RPCArg::DefaultHint{"true for watch-only wallets, otherwise false"}, "Also select inputs which are watch only"},
                            {"lockUnspents", RPCArg::Type::BOOL, RPCArg::Default{false}, "Lock selected unspent outputs"},
                            {"fee_rate", RPCArg::Type::AMOUNT, RPCArg::DefaultHint{"not set, fall back to wallet fee estimation"}, "Specify a fee rate in " + CURRENCY_ATOM + "/vB."},
                            {"feeRate", RPCArg::Type::AMOUNT, RPCArg::DefaultHint{"not set, fall back to wallet fee estimation"}, "Specify a fee rate in " + CURRENCY_UNIT + "/kvB."},
                            {"subtractFeeFromOutputs", RPCArg::Type::ARR, RPCArg::Default{UniValue::VARR}, "The outputs to subtract the fee from.\n"
                                                          "The fee will be equally deducted from the amount of each specified output.\n"
                                                          "Those recipients will receive less bitcoins than you enter in their corresponding amount field.\n"
                                                          "If no outputs are specified here, the sender pays the fee.",
                                {
                                    {"vout_index", RPCArg::Type::NUM, RPCArg::Optional::OMITTED, "The zero-based output index, before a change output is added."},
                                },
                            },
                            {"max_tx_weight", RPCArg::Type::NUM, RPCArg::Default{MAX_STANDARD_TX_WEIGHT}, "The maximum acceptable transaction weight.\n"
                                                          "Transaction building will fail if this can not be satisfied."},
                        },
                        FundTxDoc()),
                        RPCArgOptions{.oneline_description="options"}},
                    {"bip32derivs", RPCArg::Type::BOOL, RPCArg::Default{true}, "Include BIP 32 derivation paths for public keys if we know them"},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR, "psbt", "The resulting raw transaction (base64-encoded string)"},
                        {RPCResult::Type::STR_AMOUNT, "fee", "Fee in " + CURRENCY_UNIT + " the resulting transaction pays"},
                        {RPCResult::Type::NUM, "changepos", "The position of the added change output, or -1"},
                    }
                                },
                                RPCExamples{
                            "\nCreate a transaction with no inputs\n"
                            + HelpExampleCli("walletcreatefundedpsbt", "\"[{\\\"txid\\\":\\\"myid\\\",\\\"vout\\\":0}]\" \"[{\\\"data\\\":\\\"00010203\\\"}]\"")
                                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    CWallet& wallet{*pwallet};
    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    wallet.BlockUntilSyncedToCurrentChain();

    UniValue options{request.params[3].isNull() ? UniValue::VOBJ : request.params[3]};

    const UniValue &replaceable_arg = options["replaceable"];
    const bool rbf{replaceable_arg.isNull() ? wallet.m_signal_rbf : replaceable_arg.get_bool()};
    CMutableTransaction rawTx = ConstructTransaction(request.params[0], request.params[1], request.params[2], rbf);
    UniValue outputs(UniValue::VOBJ);
    outputs = NormalizeOutputs(request.params[1]);
    std::vector<CRecipient> recipients = CreateRecipients(
            ParseOutputs(outputs),
            InterpretSubtractFeeFromOutputInstructions(options["subtractFeeFromOutputs"], outputs.getKeys())
    );
    CCoinControl coin_control;
    // Automatically select coins, unless at least one is manually selected. Can
    // be overridden by options.add_inputs.
    coin_control.m_allow_other_inputs = rawTx.vin.size() == 0;
    SetOptionsInputWeights(request.params[0], options);
    // Clear tx.vout since it is not meant to be used now that we are passing outputs directly.
    // This sets us up for a future PR to completely remove tx from the function signature in favor of passing inputs directly
    rawTx.vout.clear();
    auto txr = FundTransaction(wallet, rawTx, recipients, options, coin_control, /*override_min_fee=*/true);

    // Make a blank psbt
    PartiallySignedTransaction psbtx(CMutableTransaction(*txr.tx));

    // Fill transaction with out data but don't sign
    bool bip32derivs = request.params[4].isNull() ? true : request.params[4].get_bool();
    bool complete = true;
    const auto err{wallet.FillPSBT(psbtx, complete, 1, /*sign=*/false, /*bip32derivs=*/bip32derivs)};
    if (err) {
        throw JSONRPCPSBTError(*err);
    }

    // Serialize the PSBT
    DataStream ssTx{};
    ssTx << psbtx;

    UniValue result(UniValue::VOBJ);
    result.pushKV("psbt", EncodeBase64(ssTx.str()));
    result.pushKV("fee", ValueFromAmount(txr.fee));
    result.pushKV("changepos", txr.change_pos ? (int)*txr.change_pos : -1);
    return result;
},
    };
}